

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O2

void cdftocsv::processrec(char *rec)

{
  ulong uVar1;
  
  uVar1 = 0;
  while ((int)uVar1 < *(int *)(rec + 0xc)) {
    fprintf(_stdout,"%d,%u,%d,%d,%f,%f\n",(double)*(float *)(rec + uVar1 * 8 + 0x10),
            (double)*(float *)(rec + uVar1 * 8 + 0x14),(ulong)*(uint *)rec,(ulong)*(uint *)(rec + 4)
            ,(ulong)*(uint *)(rec + 8),uVar1 + 1 & 0xffffffff);
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

void processrec(char *rec)
	{
		damagecdfrec *d = (damagecdfrec *)rec;
		char *b = rec + sizeof(damagecdfrec);
		int *bin_count = (int *)b;
		b = b + sizeof(int);
		prob_mean *pp = (prob_mean *)b;
		for (int bin_index = 0; bin_index < *bin_count; bin_index++) {
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
			fprintf(stdout, "%d,%llu,%d,%d,%f,%f\n", d->event_id, d->areaperil_id, d->vulnerability_id, bin_index + 1, pp->prob_to, pp->bin_mean);
#else
			fprintf(stdout, "%d,%u,%d,%d,%f,%f\n", d->event_id, d->areaperil_id, d->vulnerability_id, bin_index + 1, pp->prob_to, pp->bin_mean);
#endif
			pp++;
		}
	}